

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O0

void __thiscall crnlib::corpus_tester::corpus_tester(corpus_tester *this)

{
  long in_RDI;
  uint in_stack_0000003c;
  uint in_stack_00000040;
  uint in_stack_00000044;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_00000048;
  
  image<crnlib::color_quad<unsigned_char,_int>_>::image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10aa87);
  color_quad<unsigned_char,_int>::make_black();
  image<crnlib::color_quad<unsigned_char,_int>_>::resize
            (in_stack_00000048,in_stack_00000044,in_stack_00000040,in_stack_0000003c,
             (color_quad<unsigned_char,_int> *)this);
  *(undefined4 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  return;
}

Assistant:

corpus_tester::corpus_tester() {
  m_bad_block_img.resize(256, 256);
  m_next_bad_block_index = 0;
  m_total_bad_block_files = 0;
}